

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImTriangulator::BuildNodes(ImTriangulator *this,ImVec2 *points,int points_count)

{
  ImTriangulatorNode *pIVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = 0;
  uVar3 = 0;
  if (0 < points_count) {
    uVar3 = (ulong)(uint)points_count;
  }
  lVar4 = 0x20;
  for (; pIVar1 = this->_Nodes, uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(undefined4 *)((long)&pIVar1[-1].Type + lVar4) = 0;
    *(int *)((long)pIVar1 + lVar4 + -0x1c) = (int)uVar2;
    *(ImVec2 *)((long)pIVar1 + lVar4 + -0x18) = points[uVar2];
    pIVar1 = this->_Nodes;
    *(long *)((long)pIVar1 + lVar4 + -0x10) = (long)&pIVar1->Type + lVar4;
    *(long *)((long)pIVar1 + lVar4 + -8) = (long)&pIVar1[-2].Type + lVar4;
    lVar4 = lVar4 + 0x20;
  }
  pIVar1->Prev = pIVar1 + (long)points_count + -1;
  pIVar1[(long)points_count + -1].Next = pIVar1;
  return;
}

Assistant:

void ImTriangulator::BuildNodes(const ImVec2* points, int points_count)
{
    for (int i = 0; i < points_count; i++)
    {
        _Nodes[i].Type = ImTriangulatorNodeType_Convex;
        _Nodes[i].Index = i;
        _Nodes[i].Pos = points[i];
        _Nodes[i].Next = _Nodes + i + 1;
        _Nodes[i].Prev = _Nodes + i - 1;
    }
    _Nodes[0].Prev = _Nodes + points_count - 1;
    _Nodes[points_count - 1].Next = _Nodes;
}